

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O2

void __thiscall
QTreeViewPrivate::prepareAnimatedOperation(QTreeViewPrivate *this,int item,Direction direction)

{
  AnimatedOperation *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QRect QVar6;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar1 = &this->animatedOperation;
  (this->animatedOperation).item = item;
  (this->animatedOperation).viewport =
       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport;
  QAbstractAnimation::setDirection((Direction)pAVar1);
  iVar2 = coordinateForItem(this,item);
  iVar3 = itemHeight(this,item);
  iVar3 = iVar3 + iVar2;
  QVar6 = QWidget::rect((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        viewport);
  if (direction == Backward) {
    iVar5 = (*(uint *)&(this->viewItems).d.ptr[item].field_0x1c >> 4) + item;
    for (iVar2 = 0; (item < iVar5 && (iVar2 < (QVar6.y2.m_i.m_i - iVar3) * 2 + 2));
        iVar2 = iVar2 + iVar4) {
      item = item + 1;
      iVar4 = itemHeight(this,item);
    }
    ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffa8,iVar2 + iVar3);
    QVariantAnimation::setEndValue((QVariant *)pAVar1);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffa8);
  }
  ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffa8,iVar3);
  QVariantAnimation::setStartValue((QVariant *)pAVar1);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffa8);
  renderTreeToPixmapForAnimation((QTreeViewPrivate *)&stack0xffffffffffffffa8,(QRect *)this);
  QPixmap::operator=(&(this->animatedOperation).before,(QPixmap *)&stack0xffffffffffffffa8);
  QPixmap::~QPixmap((QPixmap *)&stack0xffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::prepareAnimatedOperation(int item, QVariantAnimation::Direction direction)
{
    animatedOperation.item = item;
    animatedOperation.viewport = viewport;
    animatedOperation.setDirection(direction);

    int top = coordinateForItem(item) + itemHeight(item);
    QRect rect = viewport->rect();
    rect.setTop(top);
    if (direction == QVariantAnimation::Backward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = item + viewItems.at(item).total + 1;
        for (int i = item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(top + h);
    }
    animatedOperation.setStartValue(top);
    animatedOperation.before = renderTreeToPixmapForAnimation(rect);
}